

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void clear_all_line_same(Am_Object *scroll_menu)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object sel;
  Am_Value_List sel_list;
  Am_Object local_30;
  Am_Value_List local_28;
  
  pAVar2 = Am_Object::Get(scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List(&local_28,pAVar2);
  bVar1 = Am_Value_List::Valid(&local_28);
  if (bVar1) {
    local_30.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&local_28);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_28);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&local_28);
      Am_Object::operator=(&local_30,pAVar2);
      set_text_leaf_parts(&local_30,&Am_No_Style);
      Am_Value_List::Next(&local_28);
    }
    Am_Object::~Am_Object(&local_30);
  }
  Am_Value_List::~Am_Value_List(&local_28);
  return;
}

Assistant:

void
clear_all_line_same(Am_Object &scroll_menu)
{
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid()) {
    Am_Object sel;
    for (sel_list.Start(); !sel_list.Last(); sel_list.Next()) {
      sel = sel_list.Get();
      set_text_leaf_parts(sel, Am_No_Style);
    }
  }
}